

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

int DoQuantizeBlock_SSE2(int16_t *in,int16_t *out,uint16_t *sharpen,VP8Matrix *mtx)

{
  undefined2 uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  undefined8 *puVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined4 uVar34;
  undefined2 in_CX;
  undefined6 in_register_0000000a;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  ulong *in_RDI;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  ulong uVar39;
  ulong uVar40;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  ulong uVar47;
  ulong uVar48;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  __m128i out_08;
  __m128i out_04;
  __m128i out_00;
  __m128i coeff_iQ8L;
  __m128i coeff_iQ8H;
  __m128i coeff_iQ0L;
  __m128i coeff_iQ0H;
  __m128i sharpen8;
  __m128i sharpen0;
  __m128i sign8;
  __m128i sign0;
  __m128i q8;
  __m128i q0;
  __m128i iq8;
  __m128i iq0;
  __m128i in8;
  __m128i in0;
  __m128i packed_out;
  __m128i out8;
  __m128i out0;
  __m128i coeff8;
  __m128i coeff0;
  __m128i zero;
  __m128i max_coeff_2047;
  undefined1 local_7c8 [16];
  undefined1 local_7b8 [16];
  undefined2 uStack_764;
  undefined2 uStack_762;
  undefined2 uStack_75c;
  undefined2 uStack_75a;
  undefined2 uStack_754;
  undefined2 uStack_752;
  undefined2 uStack_74c;
  undefined2 uStack_74a;
  undefined2 uStack_744;
  undefined2 uStack_742;
  undefined2 uStack_73c;
  undefined2 uStack_73a;
  undefined2 uStack_734;
  undefined2 uStack_732;
  undefined2 uStack_72c;
  undefined2 uStack_72a;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined1 local_638 [16];
  undefined1 local_628 [16];
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  short local_528;
  short sStack_526;
  short sStack_524;
  short sStack_522;
  short sStack_520;
  short sStack_51e;
  short sStack_51c;
  short sStack_51a;
  short local_508;
  short sStack_506;
  short sStack_504;
  short sStack_502;
  short sStack_500;
  short sStack_4fe;
  short sStack_4fc;
  short sStack_4fa;
  short local_4e8;
  short sStack_4e6;
  short sStack_4e4;
  short sStack_4e2;
  short sStack_4e0;
  short sStack_4de;
  short sStack_4dc;
  short sStack_4da;
  short local_4c8;
  short sStack_4c6;
  short sStack_4c4;
  short sStack_4c2;
  short sStack_4c0;
  short sStack_4be;
  short sStack_4bc;
  short sStack_4ba;
  short local_4a8;
  short sStack_4a6;
  short sStack_4a4;
  short sStack_4a2;
  short sStack_4a0;
  short sStack_49e;
  short sStack_49c;
  short sStack_49a;
  short local_488;
  short sStack_486;
  short sStack_484;
  short sStack_482;
  short sStack_480;
  short sStack_47e;
  short sStack_47c;
  short sStack_47a;
  int local_3d8;
  int iStack_3d4;
  int iStack_3d0;
  int iStack_3cc;
  int iStack_3c4;
  int iStack_3bc;
  int local_3b8;
  int iStack_3b4;
  int iStack_3b0;
  int iStack_3ac;
  int iStack_3a4;
  int iStack_39c;
  int local_398;
  int iStack_394;
  int iStack_390;
  int iStack_38c;
  int iStack_384;
  int iStack_37c;
  int local_378;
  int iStack_374;
  int iStack_370;
  int iStack_36c;
  int iStack_364;
  int iStack_35c;
  short local_358;
  short sStack_356;
  short sStack_354;
  short sStack_352;
  short sStack_350;
  short sStack_34e;
  short sStack_34c;
  short sStack_34a;
  short local_338;
  short sStack_336;
  short sStack_334;
  short sStack_332;
  short sStack_330;
  short sStack_32e;
  short sStack_32c;
  short sStack_32a;
  short local_298;
  short sStack_296;
  short sStack_294;
  short sStack_290;
  short sStack_28e;
  short sStack_28c;
  short local_278;
  short sStack_276;
  short sStack_274;
  short sStack_270;
  short sStack_26e;
  short sStack_26c;
  short local_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  short sStack_210;
  short sStack_20e;
  short sStack_20c;
  short sStack_20a;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  short local_1c8;
  short sStack_1c6;
  short sStack_1c4;
  short sStack_1c2;
  short sStack_1c0;
  short sStack_1be;
  short sStack_1bc;
  short sStack_1ba;
  short local_1b8;
  short sStack_1b6;
  short sStack_1b4;
  short sStack_1b2;
  short sStack_1b0;
  short sStack_1ae;
  short sStack_1ac;
  short sStack_1aa;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short sStack_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  undefined2 local_198;
  undefined2 uStack_196;
  undefined2 uStack_194;
  undefined2 uStack_192;
  undefined2 local_178;
  undefined2 uStack_176;
  undefined2 uStack_174;
  undefined2 uStack_172;
  undefined2 uStack_150;
  undefined2 uStack_14e;
  undefined2 uStack_14c;
  undefined2 uStack_14a;
  undefined2 uStack_130;
  undefined2 uStack_12e;
  undefined2 uStack_12c;
  undefined2 uStack_12a;
  int iStack_104;
  int iStack_fc;
  int iStack_e4;
  int iStack_dc;
  int iStack_c4;
  int iStack_bc;
  int iStack_a4;
  int iStack_9c;
  int16_t outZ_3;
  int16_t outZ_12;
  __m128i outZ8;
  __m128i outZ0;
  __m128i bias_12;
  __m128i bias_08;
  __m128i bias_04;
  __m128i bias_00;
  __m128i out_12;
  
  puVar18 = (undefined8 *)CONCAT62(in_register_0000000a,in_CX);
  uVar39 = *in_RDI;
  uVar47 = in_RDI[1];
  uVar40 = in_RDI[2];
  uVar48 = in_RDI[3];
  uVar19 = *(undefined8 *)*(undefined1 (*) [16])(puVar18 + 4);
  uVar20 = puVar18[5];
  uVar21 = *(undefined8 *)*(undefined1 (*) [16])(puVar18 + 6);
  uVar22 = puVar18[7];
  uVar23 = *puVar18;
  uVar24 = puVar18[1];
  uVar25 = puVar18[2];
  uVar26 = puVar18[3];
  local_278 = (short)uVar39;
  sStack_276 = (short)(uVar39 >> 0x10);
  sStack_274 = (short)(uVar39 >> 0x20);
  sStack_270 = (short)uVar47;
  sStack_26e = (short)(uVar47 >> 0x10);
  sStack_26c = (short)(uVar47 >> 0x20);
  uVar2 = (ushort)(local_278 < 0);
  uVar4 = (ushort)(sStack_276 < 0);
  uVar6 = (ushort)(sStack_274 < 0);
  uVar8 = (ushort)((long)uVar39 < 0);
  uVar10 = (ushort)(sStack_270 < 0);
  uVar12 = (ushort)(sStack_26e < 0);
  uVar14 = (ushort)(sStack_26c < 0);
  uVar16 = (ushort)((long)uVar47 < 0);
  local_298 = (short)uVar40;
  sStack_296 = (short)(uVar40 >> 0x10);
  sStack_294 = (short)(uVar40 >> 0x20);
  sStack_290 = (short)uVar48;
  sStack_28e = (short)(uVar48 >> 0x10);
  sStack_28c = (short)(uVar48 >> 0x20);
  uVar3 = (ushort)(local_298 < 0);
  uVar5 = (ushort)(sStack_296 < 0);
  uVar7 = (ushort)(sStack_294 < 0);
  uVar9 = (ushort)((long)uVar40 < 0);
  uVar11 = (ushort)(sStack_290 < 0);
  uVar13 = (ushort)(sStack_28e < 0);
  uVar15 = (ushort)(sStack_28c < 0);
  uVar17 = (ushort)((long)uVar48 < 0);
  uVar39 = uVar39 ^ CONCAT26(-uVar8,CONCAT24(-uVar6,CONCAT22(-uVar4,-uVar2)));
  uVar47 = uVar47 ^ CONCAT26(-uVar16,CONCAT24(-uVar14,CONCAT22(-uVar12,-uVar10)));
  uVar40 = uVar40 ^ CONCAT26(-uVar9,CONCAT24(-uVar7,CONCAT22(-uVar5,-uVar3)));
  uVar48 = uVar48 ^ CONCAT26(-uVar17,CONCAT24(-uVar15,CONCAT22(-uVar13,-uVar11)));
  local_4c8 = (short)uVar39;
  sStack_4c6 = (short)(uVar39 >> 0x10);
  sStack_4c4 = (short)(uVar39 >> 0x20);
  sStack_4c2 = (short)(uVar39 >> 0x30);
  sStack_4c0 = (short)uVar47;
  sStack_4be = (short)(uVar47 >> 0x10);
  sStack_4bc = (short)(uVar47 >> 0x20);
  sStack_4ba = (short)(uVar47 >> 0x30);
  local_608._0_4_ = CONCAT22(sStack_4c6 + uVar4,local_4c8 + uVar2);
  local_608._0_6_ = CONCAT24(sStack_4c4 + uVar6,(undefined4)local_608);
  local_608 = CONCAT26(sStack_4c2 + uVar8,(undefined6)local_608);
  uStack_600._0_4_ = CONCAT22(sStack_4be + uVar12,sStack_4c0 + uVar10);
  uStack_600._0_6_ = CONCAT24(sStack_4bc + uVar14,(undefined4)uStack_600);
  uStack_600 = CONCAT26(sStack_4ba + uVar16,(undefined6)uStack_600);
  local_4e8 = (short)uVar40;
  sStack_4e6 = (short)(uVar40 >> 0x10);
  sStack_4e4 = (short)(uVar40 >> 0x20);
  sStack_4e2 = (short)(uVar40 >> 0x30);
  sStack_4e0 = (short)uVar48;
  sStack_4de = (short)(uVar48 >> 0x10);
  sStack_4dc = (short)(uVar48 >> 0x20);
  sStack_4da = (short)(uVar48 >> 0x30);
  local_618._0_4_ = CONCAT22(sStack_4e6 + uVar5,local_4e8 + uVar3);
  local_618._0_6_ = CONCAT24(sStack_4e4 + uVar7,(undefined4)local_618);
  local_618 = CONCAT26(sStack_4e2 + uVar9,(undefined6)local_618);
  uStack_610._0_4_ = CONCAT22(sStack_4de + uVar13,sStack_4e0 + uVar11);
  uStack_610._0_6_ = CONCAT24(sStack_4dc + uVar15,(undefined4)uStack_610);
  uStack_610 = CONCAT26(sStack_4da + uVar17,(undefined6)uStack_610);
  if (in_RDX != (undefined8 *)0x0) {
    uVar27 = *in_RDX;
    uVar28 = in_RDX[1];
    uVar29 = in_RDX[2];
    uVar30 = in_RDX[3];
    local_338 = (short)uVar27;
    sStack_336 = (short)((ulong)uVar27 >> 0x10);
    sStack_334 = (short)((ulong)uVar27 >> 0x20);
    sStack_332 = (short)((ulong)uVar27 >> 0x30);
    sStack_330 = (short)uVar28;
    sStack_32e = (short)((ulong)uVar28 >> 0x10);
    sStack_32c = (short)((ulong)uVar28 >> 0x20);
    sStack_32a = (short)((ulong)uVar28 >> 0x30);
    local_608._0_4_ = CONCAT22(sStack_4c6 + uVar4 + sStack_336,local_4c8 + uVar2 + local_338);
    local_608._0_6_ = CONCAT24(sStack_4c4 + uVar6 + sStack_334,(undefined4)local_608);
    local_608 = CONCAT26(sStack_4c2 + uVar8 + sStack_332,(undefined6)local_608);
    uStack_600._0_4_ = CONCAT22(sStack_4be + uVar12 + sStack_32e,sStack_4c0 + uVar10 + sStack_330);
    uStack_600._0_6_ = CONCAT24(sStack_4bc + uVar14 + sStack_32c,(undefined4)uStack_600);
    uStack_600 = CONCAT26(sStack_4ba + uVar16 + sStack_32a,(undefined6)uStack_600);
    local_358 = (short)uVar29;
    sStack_356 = (short)((ulong)uVar29 >> 0x10);
    sStack_354 = (short)((ulong)uVar29 >> 0x20);
    sStack_352 = (short)((ulong)uVar29 >> 0x30);
    sStack_350 = (short)uVar30;
    sStack_34e = (short)((ulong)uVar30 >> 0x10);
    sStack_34c = (short)((ulong)uVar30 >> 0x20);
    sStack_34a = (short)((ulong)uVar30 >> 0x30);
    local_618._0_4_ = CONCAT22(sStack_4e6 + uVar5 + sStack_356,local_4e8 + uVar3 + local_358);
    local_618._0_6_ = CONCAT24(sStack_4e4 + uVar7 + sStack_354,(undefined4)local_618);
    local_618 = CONCAT26(sStack_4e2 + uVar9 + sStack_352,(undefined6)local_618);
    uStack_610._0_4_ = CONCAT22(sStack_4de + uVar13 + sStack_34e,sStack_4e0 + uVar11 + sStack_350);
    uStack_610._0_6_ = CONCAT24(sStack_4dc + uVar15 + sStack_34c,(undefined4)uStack_610);
    uStack_610 = CONCAT26(sStack_4da + uVar17 + sStack_34a,(undefined6)uStack_610);
  }
  auVar41._8_8_ = uStack_600;
  auVar41._0_8_ = local_608;
  auVar41 = pmulhuw(auVar41,*(undefined1 (*) [16])(puVar18 + 4));
  local_1a8 = (short)local_608;
  sStack_1a6 = (short)((ulong)local_608 >> 0x10);
  sStack_1a4 = (short)((ulong)local_608 >> 0x20);
  sStack_1a2 = (short)((ulong)local_608 >> 0x30);
  sStack_1a0 = (short)uStack_600;
  sStack_19e = (short)((ulong)uStack_600 >> 0x10);
  sStack_19c = (short)((ulong)uStack_600 >> 0x20);
  sStack_19a = (short)((ulong)uStack_600 >> 0x30);
  local_1b8 = (short)uVar19;
  sStack_1b6 = (short)((ulong)uVar19 >> 0x10);
  sStack_1b4 = (short)((ulong)uVar19 >> 0x20);
  sStack_1b2 = (short)((ulong)uVar19 >> 0x30);
  sStack_1b0 = (short)uVar20;
  sStack_1ae = (short)((ulong)uVar20 >> 0x10);
  sStack_1ac = (short)((ulong)uVar20 >> 0x20);
  sStack_1aa = (short)((ulong)uVar20 >> 0x30);
  auVar42._8_8_ = uStack_610;
  auVar42._0_8_ = local_618;
  auVar42 = pmulhuw(auVar42,*(undefined1 (*) [16])(puVar18 + 6));
  local_1c8 = (short)local_618;
  sStack_1c6 = (short)((ulong)local_618 >> 0x10);
  sStack_1c4 = (short)((ulong)local_618 >> 0x20);
  sStack_1c2 = (short)((ulong)local_618 >> 0x30);
  sStack_1c0 = (short)uStack_610;
  sStack_1be = (short)((ulong)uStack_610 >> 0x10);
  sStack_1bc = (short)((ulong)uStack_610 >> 0x20);
  sStack_1ba = (short)((ulong)uStack_610 >> 0x30);
  local_1d8 = (short)uVar21;
  sStack_1d6 = (short)((ulong)uVar21 >> 0x10);
  sStack_1d4 = (short)((ulong)uVar21 >> 0x20);
  sStack_1d2 = (short)((ulong)uVar21 >> 0x30);
  sStack_1d0 = (short)uVar22;
  sStack_1ce = (short)((ulong)uVar22 >> 0x10);
  sStack_1cc = (short)((ulong)uVar22 >> 0x20);
  sStack_1ca = (short)((ulong)uVar22 >> 0x30);
  local_178 = auVar41._0_2_;
  uStack_176 = auVar41._2_2_;
  uStack_174 = auVar41._4_2_;
  uStack_172 = auVar41._6_2_;
  uStack_130 = auVar41._8_2_;
  uStack_12e = auVar41._10_2_;
  uStack_12c = auVar41._12_2_;
  uStack_12a = auVar41._14_2_;
  local_198 = auVar42._0_2_;
  uStack_196 = auVar42._2_2_;
  uStack_194 = auVar42._4_2_;
  uStack_192 = auVar42._6_2_;
  uStack_150 = auVar42._8_2_;
  uStack_14e = auVar42._10_2_;
  uStack_14c = auVar42._12_2_;
  uStack_14a = auVar42._14_2_;
  iVar35 = CONCAT22(local_178,local_1a8 * local_1b8);
  iVar43 = CONCAT22(uStack_174,sStack_1a4 * sStack_1b4);
  iStack_364 = (int)(CONCAT26(uStack_176,CONCAT24(sStack_1a6 * sStack_1b6,iVar35)) >> 0x20);
  iStack_35c = (int)(CONCAT26(uStack_172,CONCAT24(sStack_1a2 * sStack_1b2,iVar43)) >> 0x20);
  local_378 = (int)puVar18[8];
  iStack_374 = (int)((ulong)puVar18[8] >> 0x20);
  iStack_370 = (int)puVar18[9];
  iStack_36c = (int)((ulong)puVar18[9] >> 0x20);
  iVar35 = iVar35 + local_378;
  iVar43 = iVar43 + iStack_370;
  uStack_734 = (undefined2)(iStack_364 + iStack_374);
  uStack_732 = (undefined2)((uint)(iStack_364 + iStack_374) >> 0x10);
  uStack_72c = (undefined2)(iStack_35c + iStack_36c);
  uStack_72a = (undefined2)((uint)(iStack_35c + iStack_36c) >> 0x10);
  iVar36 = CONCAT22(uStack_130,sStack_1a0 * sStack_1b0);
  iVar44 = CONCAT22(uStack_12c,sStack_19c * sStack_1ac);
  iStack_384 = (int)(CONCAT26(uStack_12e,CONCAT24(sStack_19e * sStack_1ae,iVar36)) >> 0x20);
  iStack_37c = (int)(CONCAT26(uStack_12a,CONCAT24(sStack_19a * sStack_1aa,iVar44)) >> 0x20);
  local_398 = (int)puVar18[10];
  iStack_394 = (int)((ulong)puVar18[10] >> 0x20);
  iStack_390 = (int)puVar18[0xb];
  iStack_38c = (int)((ulong)puVar18[0xb] >> 0x20);
  iVar36 = iVar36 + local_398;
  iVar44 = iVar44 + iStack_390;
  uStack_744 = (undefined2)(iStack_384 + iStack_394);
  uStack_742 = (undefined2)((uint)(iStack_384 + iStack_394) >> 0x10);
  uStack_73c = (undefined2)(iStack_37c + iStack_38c);
  uStack_73a = (undefined2)((uint)(iStack_37c + iStack_38c) >> 0x10);
  iVar37 = CONCAT22(local_198,local_1c8 * local_1d8);
  iVar45 = CONCAT22(uStack_194,sStack_1c4 * sStack_1d4);
  iStack_3a4 = (int)(CONCAT26(uStack_196,CONCAT24(sStack_1c6 * sStack_1d6,iVar37)) >> 0x20);
  iStack_39c = (int)(CONCAT26(uStack_192,CONCAT24(sStack_1c2 * sStack_1d2,iVar45)) >> 0x20);
  local_3b8 = (int)puVar18[0xc];
  iStack_3b4 = (int)((ulong)puVar18[0xc] >> 0x20);
  iStack_3b0 = (int)puVar18[0xd];
  iStack_3ac = (int)((ulong)puVar18[0xd] >> 0x20);
  iVar37 = iVar37 + local_3b8;
  iVar45 = iVar45 + iStack_3b0;
  uStack_754 = (undefined2)(iStack_3a4 + iStack_3b4);
  uStack_752 = (undefined2)((uint)(iStack_3a4 + iStack_3b4) >> 0x10);
  uStack_74c = (undefined2)(iStack_39c + iStack_3ac);
  uStack_74a = (undefined2)((uint)(iStack_39c + iStack_3ac) >> 0x10);
  iVar38 = CONCAT22(uStack_150,sStack_1c0 * sStack_1d0);
  iVar46 = CONCAT22(uStack_14c,sStack_1bc * sStack_1cc);
  iStack_3c4 = (int)(CONCAT26(uStack_14e,CONCAT24(sStack_1be * sStack_1ce,iVar38)) >> 0x20);
  iStack_3bc = (int)(CONCAT26(uStack_14a,CONCAT24(sStack_1ba * sStack_1ca,iVar46)) >> 0x20);
  local_3d8 = (int)puVar18[0xe];
  iStack_3d4 = (int)((ulong)puVar18[0xe] >> 0x20);
  iStack_3d0 = (int)puVar18[0xf];
  iStack_3cc = (int)((ulong)puVar18[0xf] >> 0x20);
  iVar38 = iVar38 + local_3d8;
  iVar46 = iVar46 + iStack_3d0;
  uStack_764 = (undefined2)(iStack_3c4 + iStack_3d4);
  uStack_762 = (undefined2)((uint)(iStack_3c4 + iStack_3d4) >> 0x10);
  uStack_75c = (undefined2)(iStack_3bc + iStack_3cc);
  uStack_75a = (undefined2)((uint)(iStack_3bc + iStack_3cc) >> 0x10);
  iStack_a4 = (int)(CONCAT26(uStack_732,CONCAT24(uStack_734,iVar35)) >> 0x20);
  iStack_9c = (int)(CONCAT26(uStack_72a,CONCAT24(uStack_72c,iVar43)) >> 0x20);
  auVar42 = ZEXT416(0x11);
  uStack_734 = (undefined2)(iStack_a4 >> auVar42);
  uStack_732 = (undefined2)((uint)(iStack_a4 >> auVar42) >> 0x10);
  uStack_72c = (undefined2)(iStack_9c >> auVar42);
  uStack_72a = (undefined2)((uint)(iStack_9c >> auVar42) >> 0x10);
  iStack_c4 = (int)(CONCAT26(uStack_742,CONCAT24(uStack_744,iVar36)) >> 0x20);
  iStack_bc = (int)(CONCAT26(uStack_73a,CONCAT24(uStack_73c,iVar44)) >> 0x20);
  auVar41 = ZEXT416(0x11);
  uStack_744 = (undefined2)(iStack_c4 >> auVar41);
  uStack_742 = (undefined2)((uint)(iStack_c4 >> auVar41) >> 0x10);
  uStack_73c = (undefined2)(iStack_bc >> auVar41);
  uStack_73a = (undefined2)((uint)(iStack_bc >> auVar41) >> 0x10);
  iStack_e4 = (int)(CONCAT26(uStack_752,CONCAT24(uStack_754,iVar37)) >> 0x20);
  iStack_dc = (int)(CONCAT26(uStack_74a,CONCAT24(uStack_74c,iVar45)) >> 0x20);
  auVar49 = ZEXT416(0x11);
  uStack_754 = (undefined2)(iStack_e4 >> auVar49);
  uStack_752 = (undefined2)((uint)(iStack_e4 >> auVar49) >> 0x10);
  uStack_74c = (undefined2)(iStack_dc >> auVar49);
  uStack_74a = (undefined2)((uint)(iStack_dc >> auVar49) >> 0x10);
  iStack_104 = (int)(CONCAT26(uStack_762,CONCAT24(uStack_764,iVar38)) >> 0x20);
  iStack_fc = (int)(CONCAT26(uStack_75a,CONCAT24(uStack_75c,iVar46)) >> 0x20);
  auVar50 = ZEXT416(0x11);
  uStack_764 = (undefined2)(iStack_104 >> auVar50);
  uStack_762 = (undefined2)((uint)(iStack_104 >> auVar50) >> 0x10);
  uStack_75c = (undefined2)(iStack_fc >> auVar50);
  uStack_75a = (undefined2)((uint)(iStack_fc >> auVar50) >> 0x10);
  auVar33._4_2_ = uStack_734;
  auVar33._0_4_ = iVar35 >> auVar42;
  auVar33._6_2_ = uStack_732;
  auVar33._12_2_ = uStack_72c;
  auVar33._8_4_ = iVar43 >> auVar42;
  auVar33._14_2_ = uStack_72a;
  auVar32._4_2_ = uStack_744;
  auVar32._0_4_ = iVar36 >> auVar41;
  auVar32._6_2_ = uStack_742;
  auVar32._12_2_ = uStack_73c;
  auVar32._8_4_ = iVar44 >> auVar41;
  auVar32._14_2_ = uStack_73a;
  auVar42 = packssdw(auVar33,auVar32);
  auVar31._4_2_ = uStack_754;
  auVar31._0_4_ = iVar37 >> auVar49;
  auVar31._6_2_ = uStack_752;
  auVar31._12_2_ = uStack_74c;
  auVar31._8_4_ = iVar45 >> auVar49;
  auVar31._14_2_ = uStack_74a;
  auVar49._4_2_ = uStack_764;
  auVar49._0_4_ = iVar38 >> auVar50;
  auVar49._6_2_ = uStack_762;
  auVar49._12_2_ = uStack_75c;
  auVar49._8_4_ = iVar46 >> auVar50;
  auVar49._14_2_ = uStack_75a;
  auVar41 = packssdw(auVar31,auVar49);
  local_488 = auVar42._0_2_;
  sStack_486 = auVar42._2_2_;
  sStack_484 = auVar42._4_2_;
  sStack_482 = auVar42._6_2_;
  sStack_480 = auVar42._8_2_;
  sStack_47e = auVar42._10_2_;
  sStack_47c = auVar42._12_2_;
  sStack_47a = auVar42._14_2_;
  local_628._2_2_ =
       (ushort)(0x7ff < sStack_486) * 0x7ff | (ushort)(0x7ff >= sStack_486) * sStack_486;
  local_628._0_2_ = (ushort)(0x7ff < local_488) * 0x7ff | (ushort)(0x7ff >= local_488) * local_488;
  local_628._4_2_ =
       (ushort)(0x7ff < sStack_484) * 0x7ff | (ushort)(0x7ff >= sStack_484) * sStack_484;
  local_628._6_2_ =
       (ushort)(0x7ff < sStack_482) * 0x7ff | (ushort)(0x7ff >= sStack_482) * sStack_482;
  local_628._8_2_ =
       (ushort)(0x7ff < sStack_480) * 0x7ff | (ushort)(0x7ff >= sStack_480) * sStack_480;
  local_628._10_2_ =
       (ushort)(0x7ff < sStack_47e) * 0x7ff | (ushort)(0x7ff >= sStack_47e) * sStack_47e;
  local_628._12_2_ =
       (ushort)(0x7ff < sStack_47c) * 0x7ff | (ushort)(0x7ff >= sStack_47c) * sStack_47c;
  local_628._14_2_ =
       (ushort)(0x7ff < sStack_47a) * 0x7ff | (ushort)(0x7ff >= sStack_47a) * sStack_47a;
  local_4a8 = auVar41._0_2_;
  sStack_4a6 = auVar41._2_2_;
  sStack_4a4 = auVar41._4_2_;
  sStack_4a2 = auVar41._6_2_;
  sStack_4a0 = auVar41._8_2_;
  sStack_49e = auVar41._10_2_;
  sStack_49c = auVar41._12_2_;
  sStack_49a = auVar41._14_2_;
  local_638._2_2_ =
       (ushort)(0x7ff < sStack_4a6) * 0x7ff | (ushort)(0x7ff >= sStack_4a6) * sStack_4a6;
  local_638._0_2_ = (ushort)(0x7ff < local_4a8) * 0x7ff | (ushort)(0x7ff >= local_4a8) * local_4a8;
  local_638._4_2_ =
       (ushort)(0x7ff < sStack_4a4) * 0x7ff | (ushort)(0x7ff >= sStack_4a4) * sStack_4a4;
  local_638._6_2_ =
       (ushort)(0x7ff < sStack_4a2) * 0x7ff | (ushort)(0x7ff >= sStack_4a2) * sStack_4a2;
  local_638._8_2_ =
       (ushort)(0x7ff < sStack_4a0) * 0x7ff | (ushort)(0x7ff >= sStack_4a0) * sStack_4a0;
  local_638._10_2_ =
       (ushort)(0x7ff < sStack_49e) * 0x7ff | (ushort)(0x7ff >= sStack_49e) * sStack_49e;
  local_638._12_2_ =
       (ushort)(0x7ff < sStack_49c) * 0x7ff | (ushort)(0x7ff >= sStack_49c) * sStack_49c;
  local_638._14_2_ =
       (ushort)(0x7ff < sStack_49a) * 0x7ff | (ushort)(0x7ff >= sStack_49a) * sStack_49a;
  uVar39 = local_628._0_8_ ^ CONCAT26(-uVar8,CONCAT24(-uVar6,CONCAT22(-uVar4,-uVar2)));
  uVar40 = local_628._8_8_ ^ CONCAT26(-uVar16,CONCAT24(-uVar14,CONCAT22(-uVar12,-uVar10)));
  uVar47 = local_638._0_8_ ^ CONCAT26(-uVar9,CONCAT24(-uVar7,CONCAT22(-uVar5,-uVar3)));
  uVar48 = local_638._8_8_ ^ CONCAT26(-uVar17,CONCAT24(-uVar15,CONCAT22(-uVar13,-uVar11)));
  local_508 = (short)uVar39;
  sStack_506 = (short)(uVar39 >> 0x10);
  sStack_504 = (short)(uVar39 >> 0x20);
  sStack_502 = (short)(uVar39 >> 0x30);
  sStack_500 = (short)uVar40;
  sStack_4fe = (short)(uVar40 >> 0x10);
  sStack_4fc = (short)(uVar40 >> 0x20);
  sStack_4fa = (short)(uVar40 >> 0x30);
  local_628._2_2_ = sStack_506 + uVar4;
  local_628._0_2_ = local_508 + uVar2;
  local_628._4_2_ = sStack_504 + uVar6;
  local_628._6_2_ = sStack_502 + uVar8;
  local_628._8_2_ = sStack_500 + uVar10;
  local_628._10_2_ = sStack_4fe + uVar12;
  local_628._12_2_ = sStack_4fc + uVar14;
  local_628._14_2_ = sStack_4fa + uVar16;
  local_528 = (short)uVar47;
  sStack_526 = (short)(uVar47 >> 0x10);
  sStack_524 = (short)(uVar47 >> 0x20);
  sStack_522 = (short)(uVar47 >> 0x30);
  sStack_520 = (short)uVar48;
  sStack_51e = (short)(uVar48 >> 0x10);
  sStack_51c = (short)(uVar48 >> 0x20);
  sStack_51a = (short)(uVar48 >> 0x30);
  local_638._2_2_ = sStack_526 + uVar5;
  local_638._0_2_ = local_528 + uVar3;
  local_638._4_2_ = sStack_524 + uVar7;
  local_638._6_2_ = sStack_522 + uVar9;
  local_638._8_2_ = sStack_520 + uVar11;
  local_638._10_2_ = sStack_51e + uVar13;
  local_638._12_2_ = sStack_51c + uVar15;
  local_638._14_2_ = sStack_51a + uVar17;
  local_1f8 = (short)uVar23;
  sStack_1f6 = (short)((ulong)uVar23 >> 0x10);
  sStack_1f4 = (short)((ulong)uVar23 >> 0x20);
  sStack_1f2 = (short)((ulong)uVar23 >> 0x30);
  sStack_1f0 = (short)uVar24;
  sStack_1ee = (short)((ulong)uVar24 >> 0x10);
  sStack_1ec = (short)((ulong)uVar24 >> 0x20);
  sStack_1ea = (short)((ulong)uVar24 >> 0x30);
  local_658 = CONCAT26((sStack_502 + uVar8) * sStack_1f2,
                       CONCAT24((sStack_504 + uVar6) * sStack_1f4,
                                CONCAT22((sStack_506 + uVar4) * sStack_1f6,
                                         (local_508 + uVar2) * local_1f8)));
  uStack_650 = CONCAT26((sStack_4fa + uVar16) * sStack_1ea,
                        CONCAT24((sStack_4fc + uVar14) * sStack_1ec,
                                 CONCAT22((sStack_4fe + uVar12) * sStack_1ee,
                                          (sStack_500 + uVar10) * sStack_1f0)));
  local_218 = (short)uVar25;
  sStack_216 = (short)((ulong)uVar25 >> 0x10);
  sStack_214 = (short)((ulong)uVar25 >> 0x20);
  sStack_212 = (short)((ulong)uVar25 >> 0x30);
  sStack_210 = (short)uVar26;
  sStack_20e = (short)((ulong)uVar26 >> 0x10);
  sStack_20c = (short)((ulong)uVar26 >> 0x20);
  sStack_20a = (short)((ulong)uVar26 >> 0x30);
  local_668 = CONCAT26((sStack_522 + uVar9) * sStack_212,
                       CONCAT24((sStack_524 + uVar7) * sStack_214,
                                CONCAT22((sStack_526 + uVar5) * sStack_216,
                                         (local_528 + uVar3) * local_218)));
  uStack_660 = CONCAT26((sStack_51a + uVar17) * sStack_20a,
                        CONCAT24((sStack_51c + uVar15) * sStack_20c,
                                 CONCAT22((sStack_51e + uVar13) * sStack_20e,
                                          (sStack_520 + uVar11) * sStack_210)));
  *in_RDI = local_658;
  in_RDI[1] = uStack_650;
  in_RDI[2] = local_668;
  in_RDI[3] = uStack_660;
  auVar42 = pshufhw(local_628,local_628,0x9c);
  local_7b8._0_4_ = auVar42._0_4_;
  local_7b8._4_4_ = auVar42._4_4_;
  uVar34 = local_7b8._4_4_;
  local_7b8._8_4_ = auVar42._8_4_;
  local_7b8._12_4_ = auVar42._12_4_;
  local_7b8._4_4_ = local_7b8._8_4_;
  local_7b8._8_4_ = uVar34;
  auVar42 = pshufhw(local_7b8,local_7b8,0xd2);
  auVar41 = pshuflw(local_638,local_638,0xc9);
  local_7c8._0_4_ = auVar41._0_4_;
  local_7c8._4_4_ = auVar41._4_4_;
  uVar34 = local_7c8._4_4_;
  local_7c8._8_4_ = auVar41._8_4_;
  local_7c8._12_4_ = auVar41._12_4_;
  local_7c8._4_4_ = local_7c8._8_4_;
  local_7c8._8_4_ = uVar34;
  auVar41 = pshuflw(local_7c8,local_7c8,0x78);
  local_7b8._0_8_ = auVar42._0_8_;
  local_7b8._8_8_ = auVar42._8_8_;
  *in_RSI = local_7b8._0_8_;
  in_RSI[1] = local_7b8._8_8_;
  local_7c8._0_8_ = auVar41._0_8_;
  local_7c8._8_8_ = auVar41._8_8_;
  in_RSI[2] = local_7c8._0_8_;
  in_RSI[3] = local_7c8._8_8_;
  auVar42 = packsswb(auVar42,auVar41);
  uVar1 = *(undefined2 *)((long)in_RSI + 6);
  *(undefined2 *)((long)in_RSI + 6) = *(undefined2 *)(in_RSI + 3);
  *(undefined2 *)(in_RSI + 3) = uVar1;
  bias_00[1]._0_1_ = auVar42[0];
  bias_00[1]._1_1_ = auVar42[1];
  bias_00[1]._2_1_ = auVar42[2];
  bias_00[1]._3_1_ = auVar42[3];
  bias_00[1]._4_1_ = auVar42[4];
  bias_00[1]._5_1_ = auVar42[5];
  bias_00[1]._6_1_ = auVar42[6];
  bias_00[1]._7_1_ = auVar42[7];
  out_12[0]._0_1_ = auVar42[8];
  out_12[0]._1_1_ = auVar42[9];
  out_12[0]._2_1_ = auVar42[10];
  out_12[0]._3_1_ = auVar42[0xb];
  out_12[0]._4_1_ = auVar42[0xc];
  out_12[0]._5_1_ = auVar42[0xd];
  out_12[0]._6_1_ = auVar42[0xe];
  out_12[0]._7_1_ = auVar42[0xf];
  auVar50[1] = -(bias_00[1]._1_1_ == '\0');
  auVar50[0] = -((char)bias_00[1] == '\0');
  auVar50[2] = -(bias_00[1]._2_1_ == '\0');
  auVar50[3] = -(bias_00[1]._3_1_ == '\0');
  auVar50[4] = -(bias_00[1]._4_1_ == '\0');
  auVar50[5] = -(bias_00[1]._5_1_ == '\0');
  auVar50[6] = -(bias_00[1]._6_1_ == '\0');
  auVar50[7] = -(bias_00[1]._7_1_ == '\0');
  auVar50[8] = -((char)out_12[0] == '\0');
  auVar50[9] = -(out_12[0]._1_1_ == '\0');
  auVar50[10] = -(out_12[0]._2_1_ == '\0');
  auVar50[0xb] = -(out_12[0]._3_1_ == '\0');
  auVar50[0xc] = -(out_12[0]._4_1_ == '\0');
  auVar50[0xd] = -(out_12[0]._5_1_ == '\0');
  auVar50[0xe] = -(out_12[0]._6_1_ == '\0');
  auVar50[0xf] = -(out_12[0]._7_1_ == '\0');
  return (int)((ushort)((ushort)(SUB161(auVar50 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe |
                       (ushort)((byte)-(out_12[0]._7_1_ == '\0') >> 7) << 0xf) != 0xffff);
}

Assistant:

static WEBP_INLINE int DoQuantizeBlock_SSE2(
    int16_t in[16], int16_t out[16],
    const uint16_t* WEBP_RESTRICT const sharpen,
    const VP8Matrix* WEBP_RESTRICT const mtx) {
  const __m128i max_coeff_2047 = _mm_set1_epi16(MAX_LEVEL);
  const __m128i zero = _mm_setzero_si128();
  __m128i coeff0, coeff8;
  __m128i out0, out8;
  __m128i packed_out;

  // Load all inputs.
  __m128i in0 = _mm_loadu_si128((__m128i*)&in[0]);
  __m128i in8 = _mm_loadu_si128((__m128i*)&in[8]);
  const __m128i iq0 = _mm_loadu_si128((const __m128i*)&mtx->iq_[0]);
  const __m128i iq8 = _mm_loadu_si128((const __m128i*)&mtx->iq_[8]);
  const __m128i q0 = _mm_loadu_si128((const __m128i*)&mtx->q_[0]);
  const __m128i q8 = _mm_loadu_si128((const __m128i*)&mtx->q_[8]);

  // extract sign(in)  (0x0000 if positive, 0xffff if negative)
  const __m128i sign0 = _mm_cmpgt_epi16(zero, in0);
  const __m128i sign8 = _mm_cmpgt_epi16(zero, in8);

  // coeff = abs(in) = (in ^ sign) - sign
  coeff0 = _mm_xor_si128(in0, sign0);
  coeff8 = _mm_xor_si128(in8, sign8);
  coeff0 = _mm_sub_epi16(coeff0, sign0);
  coeff8 = _mm_sub_epi16(coeff8, sign8);

  // coeff = abs(in) + sharpen
  if (sharpen != NULL) {
    const __m128i sharpen0 = _mm_loadu_si128((const __m128i*)&sharpen[0]);
    const __m128i sharpen8 = _mm_loadu_si128((const __m128i*)&sharpen[8]);
    coeff0 = _mm_add_epi16(coeff0, sharpen0);
    coeff8 = _mm_add_epi16(coeff8, sharpen8);
  }

  // out = (coeff * iQ + B) >> QFIX
  {
    // doing calculations with 32b precision (QFIX=17)
    // out = (coeff * iQ)
    const __m128i coeff_iQ0H = _mm_mulhi_epu16(coeff0, iq0);
    const __m128i coeff_iQ0L = _mm_mullo_epi16(coeff0, iq0);
    const __m128i coeff_iQ8H = _mm_mulhi_epu16(coeff8, iq8);
    const __m128i coeff_iQ8L = _mm_mullo_epi16(coeff8, iq8);
    __m128i out_00 = _mm_unpacklo_epi16(coeff_iQ0L, coeff_iQ0H);
    __m128i out_04 = _mm_unpackhi_epi16(coeff_iQ0L, coeff_iQ0H);
    __m128i out_08 = _mm_unpacklo_epi16(coeff_iQ8L, coeff_iQ8H);
    __m128i out_12 = _mm_unpackhi_epi16(coeff_iQ8L, coeff_iQ8H);
    // out = (coeff * iQ + B)
    const __m128i bias_00 = _mm_loadu_si128((const __m128i*)&mtx->bias_[0]);
    const __m128i bias_04 = _mm_loadu_si128((const __m128i*)&mtx->bias_[4]);
    const __m128i bias_08 = _mm_loadu_si128((const __m128i*)&mtx->bias_[8]);
    const __m128i bias_12 = _mm_loadu_si128((const __m128i*)&mtx->bias_[12]);
    out_00 = _mm_add_epi32(out_00, bias_00);
    out_04 = _mm_add_epi32(out_04, bias_04);
    out_08 = _mm_add_epi32(out_08, bias_08);
    out_12 = _mm_add_epi32(out_12, bias_12);
    // out = QUANTDIV(coeff, iQ, B, QFIX)
    out_00 = _mm_srai_epi32(out_00, QFIX);
    out_04 = _mm_srai_epi32(out_04, QFIX);
    out_08 = _mm_srai_epi32(out_08, QFIX);
    out_12 = _mm_srai_epi32(out_12, QFIX);

    // pack result as 16b
    out0 = _mm_packs_epi32(out_00, out_04);
    out8 = _mm_packs_epi32(out_08, out_12);

    // if (coeff > 2047) coeff = 2047
    out0 = _mm_min_epi16(out0, max_coeff_2047);
    out8 = _mm_min_epi16(out8, max_coeff_2047);
  }

  // get sign back (if (sign[j]) out_n = -out_n)
  out0 = _mm_xor_si128(out0, sign0);
  out8 = _mm_xor_si128(out8, sign8);
  out0 = _mm_sub_epi16(out0, sign0);
  out8 = _mm_sub_epi16(out8, sign8);

  // in = out * Q
  in0 = _mm_mullo_epi16(out0, q0);
  in8 = _mm_mullo_epi16(out8, q8);

  _mm_storeu_si128((__m128i*)&in[0], in0);
  _mm_storeu_si128((__m128i*)&in[8], in8);

  // zigzag the output before storing it.
  //
  // The zigzag pattern can almost be reproduced with a small sequence of
  // shuffles. After it, we only need to swap the 7th (ending up in third
  // position instead of twelfth) and 8th values.
  {
    __m128i outZ0, outZ8;
    outZ0 = _mm_shufflehi_epi16(out0,  _MM_SHUFFLE(2, 1, 3, 0));
    outZ0 = _mm_shuffle_epi32  (outZ0, _MM_SHUFFLE(3, 1, 2, 0));
    outZ0 = _mm_shufflehi_epi16(outZ0, _MM_SHUFFLE(3, 1, 0, 2));
    outZ8 = _mm_shufflelo_epi16(out8,  _MM_SHUFFLE(3, 0, 2, 1));
    outZ8 = _mm_shuffle_epi32  (outZ8, _MM_SHUFFLE(3, 1, 2, 0));
    outZ8 = _mm_shufflelo_epi16(outZ8, _MM_SHUFFLE(1, 3, 2, 0));
    _mm_storeu_si128((__m128i*)&out[0], outZ0);
    _mm_storeu_si128((__m128i*)&out[8], outZ8);
    packed_out = _mm_packs_epi16(outZ0, outZ8);
  }
  {
    const int16_t outZ_12 = out[12];
    const int16_t outZ_3 = out[3];
    out[3] = outZ_12;
    out[12] = outZ_3;
  }

  // detect if all 'out' values are zeroes or not
  return (_mm_movemask_epi8(_mm_cmpeq_epi8(packed_out, zero)) != 0xffff);
}